

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::OneofOptions::_InternalParse(OneofOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  UninterpretedOption *msg;
  ulong tag_00;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = internal::ReadTag(local_40,&local_34,0);
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
      tag_00 = (ulong)local_34;
      if (tag_00 != 0x1f3a) break;
      local_40 = local_40 + -2;
      do {
        local_40 = local_40 + 2;
        msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                        (&this->uninterpreted_option_);
        local_40 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                             (ctx,msg,local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) &&
              (bVar1 = internal::ExpectTag<7994u>(local_40), bVar1));
    }
    if ((tag_00 == 0) || ((local_34 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
      return local_40;
    }
    if (local_34 < 8000) {
      local_40 = internal::UnknownFieldParse(local_34,&this->_internal_metadata_,local_40,ctx);
    }
    else {
      local_40 = internal::ExtensionSet::ParseField
                           (&this->_extensions_,tag_00,local_40,
                            (Message *)_OneofOptions_default_instance_,&this->_internal_metadata_,
                            ctx);
    }
  } while (local_40 != (char *)0x0);
  return (char *)0x0;
}

Assistant:

const char* OneofOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}